

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalNotOperator(Evaluator *this,GCPtr<symbols::Object> *rightExpr)

{
  Object *pOVar1;
  GCPtr<symbols::Object> *ob;
  
  pOVar1 = rightExpr->addr;
  if (pOVar1 == NATIVE_TRUE.addr) {
    ob = &NATIVE_FALSE;
  }
  else if (pOVar1 == NATIVE_FALSE.addr) {
    ob = &NATIVE_TRUE;
  }
  else {
    ob = &NATIVE_FALSE;
    if (pOVar1 == NATIVE_NULL.addr) {
      ob = &NATIVE_NULL;
    }
  }
  GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,ob);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalNotOperator(GCPtr<Object> rightExpr){
    if(rightExpr == NATIVE_TRUE){
        return NATIVE_FALSE;
    }else if(rightExpr == NATIVE_FALSE){
        return NATIVE_TRUE;
    }else if(rightExpr == NATIVE_NULL){
       return NATIVE_NULL;
    }
    return NATIVE_FALSE;
}